

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::internal::TracingMuxerImpl::InitializeConsumer
          (TracingMuxerImpl *this,TracingSessionGlobalID session_id)

{
  uint __errnum;
  pointer pRVar1;
  ConsumerEndpoint *pCVar2;
  code *pcVar3;
  _Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false> _Var4;
  ConsumerImpl *pCVar5;
  char *fname;
  uint *puVar6;
  char *pcVar7;
  _Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false> local_30;
  ConsumerImpl *local_28;
  TaskRunner *local_20;
  
  pCVar5 = FindConsumer(this,session_id);
  if (pCVar5 != (ConsumerImpl *)0x0) {
    pRVar1 = (this->backends_).
             super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->backends_).
                       super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x70) <=
        pCVar5->backend_id_) {
      fname = base::Basename(
                            "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                            );
      puVar6 = (uint *)__errno_location();
      __errnum = *puVar6;
      pcVar7 = strerror(__errnum);
      base::LogMessage(kLogError,fname,0xacfb,"%s (errno: %d, %s)",
                       "PERFETTO_CHECK(backend_id < backends_.size())",(ulong)__errnum,pcVar7);
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    local_20 = (this->task_runner_)._M_t.
               super___uniq_ptr_impl<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
               ._M_t.
               super__Tuple_impl<0UL,_perfetto::base::TaskRunner_*,_std::default_delete<perfetto::base::TaskRunner>_>
               .super__Head_base<0UL,_perfetto::base::TaskRunner_*,_false>._M_head_impl;
    local_28 = pCVar5;
    (*(pRVar1[pCVar5->backend_id_].backend)->_vptr_TracingBackend[3])(&local_30);
    _Var4._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (ConsumerEndpoint *)0x0;
    pCVar2 = (pCVar5->service_)._M_t.
             super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
             .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl;
    (pCVar5->service_)._M_t.
    super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
    .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (pCVar2 != (ConsumerEndpoint *)0x0) {
      (*pCVar2->_vptr_ConsumerEndpoint[1])();
      if (local_30._M_head_impl != (ConsumerEndpoint *)0x0) {
        (*(local_30._M_head_impl)->_vptr_ConsumerEndpoint[1])();
      }
    }
  }
  return;
}

Assistant:

void TracingMuxerImpl::InitializeConsumer(TracingSessionGlobalID session_id) {
  PERFETTO_DCHECK_THREAD(thread_checker_);

  auto* consumer = FindConsumer(session_id);
  if (!consumer)
    return;

  TracingBackendId backend_id = consumer->backend_id_;
  // |backends_| is append-only, Backend instances are always valid.
  PERFETTO_CHECK(backend_id < backends_.size());
  RegisteredBackend& backend = backends_[backend_id];

  TracingBackend::ConnectConsumerArgs conn_args;
  conn_args.consumer = consumer;
  conn_args.task_runner = task_runner_.get();
  consumer->Initialize(backend.backend->ConnectConsumer(conn_args));
}